

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O3

void __thiscall
OpenMesh::PolyConnectivity::split_edge(PolyConnectivity *this,EdgeHandle _eh,VertexHandle _vh)

{
  VertexHandle _vh_00;
  HalfedgeHandle _heh;
  HalfedgeHandle _nheh;
  int iVar1;
  HalfedgeHandle _heh_00;
  HalfedgeHandle _heh_01;
  Halfedge *pHVar2;
  Vertex *pVVar3;
  int iVar4;
  int iVar5;
  HalfedgeHandle _heh_02;
  HalfedgeHandle _nheh_00;
  
  _heh_02.super_BaseHandle.idx_ = (BaseHandle)((int)_eh.super_BaseHandle.idx_ * 2 + 1);
  _heh_00.super_BaseHandle.idx_ = (BaseHandle)((int)_eh.super_BaseHandle.idx_ * 2);
  pHVar2 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_02);
  _vh_00.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar2->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
  pHVar2 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_00);
  _heh.super_BaseHandle.idx_ = (BaseHandle)(pHVar2->prev_halfedge_handle_).super_BaseHandle.idx_;
  pHVar2 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_02);
  _nheh.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar2->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_
  ;
  pHVar2 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_00);
  iVar5 = (pHVar2->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_;
  pHVar2 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_02);
  iVar1 = (pHVar2->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_;
  pHVar2 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_02);
  _heh_01 = ArrayKernel::new_edge
                      (&this->super_ArrayKernel,
                       (VertexHandle)
                       (pHVar2->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_,
                       _vh);
  pHVar2 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_02);
  (pHVar2->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_ =
       (int)_vh.super_BaseHandle.idx_;
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh_01,_heh_00);
  _nheh_00.super_BaseHandle.idx_ =
       (BaseHandle)
       ((-((uint)_heh_01.super_BaseHandle.idx_ & 1) | 1) + (int)_heh_01.super_BaseHandle.idx_);
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh_02,_nheh_00);
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh,_heh_01);
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_nheh_00,_nheh);
  iVar4 = -1;
  if (iVar5 != -1) {
    pHVar2 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_00);
    iVar4 = (pHVar2->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_;
  }
  pHVar2 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_01);
  (pHVar2->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ = iVar4;
  iVar5 = -1;
  if (iVar1 != -1) {
    pHVar2 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_02);
    iVar5 = (pHVar2->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_;
  }
  pHVar2 = ArrayKernel::halfedge(&this->super_ArrayKernel,_nheh_00);
  (pHVar2->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ = iVar5;
  pVVar3 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
  (pVVar3->halfedge_handle_).super_BaseHandle.idx_ = (int)_heh_00.super_BaseHandle.idx_;
  adjust_outgoing_halfedge(this,_vh);
  pVVar3 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh_00);
  if ((BaseHandle)(pVVar3->halfedge_handle_).super_BaseHandle.idx_ == _heh_00.super_BaseHandle.idx_)
  {
    pVVar3 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh_00);
    (pVVar3->halfedge_handle_).super_BaseHandle.idx_ = (int)_heh_01.super_BaseHandle.idx_;
    adjust_outgoing_halfedge(this,_vh_00);
    return;
  }
  return;
}

Assistant:

void PolyConnectivity::split_edge(EdgeHandle _eh, VertexHandle _vh)
{
  HalfedgeHandle h0 = halfedge_handle(_eh, 0);
  HalfedgeHandle h1 = halfedge_handle(_eh, 1);
  
  VertexHandle vfrom = from_vertex_handle(h0);

  HalfedgeHandle ph0 = prev_halfedge_handle(h0);
  //HalfedgeHandle ph1 = prev_halfedge_handle(h1);
  
  //HalfedgeHandle nh0 = next_halfedge_handle(h0);
  HalfedgeHandle nh1 = next_halfedge_handle(h1);
  
  bool boundary0 = is_boundary(h0);
  bool boundary1 = is_boundary(h1);
  
  //add the new edge
  HalfedgeHandle new_e = new_edge(from_vertex_handle(h0), _vh);
  
  //fix the vertex of the opposite halfedge
  set_vertex_handle(h1, _vh);
  
  //fix the halfedge connectivity
  set_next_halfedge_handle(new_e, h0);
  set_next_halfedge_handle(h1, opposite_halfedge_handle(new_e));
  
  set_next_halfedge_handle(ph0, new_e);
  set_next_halfedge_handle(opposite_halfedge_handle(new_e), nh1);
  
//  set_prev_halfedge_handle(new_e, ph0);
//  set_prev_halfedge_handle(opposite_halfedge_handle(new_e), h1);
  
//  set_prev_halfedge_handle(nh1, opposite_halfedge_handle(new_e));
//  set_prev_halfedge_handle(h0, new_e);
  
  if (!boundary0)
  {
    set_face_handle(new_e, face_handle(h0));
  }
  else
  {
    set_boundary(new_e);
  }
  
  if (!boundary1)
  {
    set_face_handle(opposite_halfedge_handle(new_e), face_handle(h1));
  }
  else
  {
    set_boundary(opposite_halfedge_handle(new_e));
  }

  set_halfedge_handle( _vh, h0 );
  adjust_outgoing_halfedge( _vh );
  
  if (halfedge_handle(vfrom) == h0)
  {
    set_halfedge_handle(vfrom, new_e);
    adjust_outgoing_halfedge( vfrom );
  }
}